

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

wchar_t * __thiscall
fmt::v6::internal::float_writer<wchar_t>::prettify<wchar_t*>
          (float_writer<wchar_t> *this,wchar_t *it)

{
  bool bVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  byte bVar15;
  ulong uVar16;
  ulong uVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  long lVar21;
  int iVar26;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int iVar33;
  undefined1 auVar32 [16];
  
  uVar11 = this->num_digits_;
  uVar13 = (ulong)uVar11;
  uVar6 = this->exp_;
  uVar16 = (ulong)uVar6;
  uVar9 = uVar6 + uVar11;
  if ((this->specs_).field_0x4 == '\x01') {
    pcVar19 = this->digits_;
    *it = (int)*pcVar19;
    uVar6 = (this->specs_).precision - uVar11;
    bVar15 = (byte)(*(uint *)&(this->specs_).field_0x4 >> 0x15) & 1 & 0 < (int)uVar6;
    if (((int)uVar11 < 2) && (bVar15 == 0)) {
      pwVar7 = it + 1;
    }
    else {
      it[1] = this->decimal_point_;
      pwVar7 = it + 2;
    }
    if (1 < (int)uVar11) {
      lVar12 = uVar13 + 1;
      do {
        pcVar19 = pcVar19 + 1;
        *pwVar7 = (int)*pcVar19;
        pwVar7 = pwVar7 + 1;
        lVar12 = lVar12 + -1;
      } while (2 < lVar12);
    }
    auVar5 = _DAT_0020a170;
    auVar4 = _DAT_00207570;
    auVar3 = _DAT_00201020;
    pwVar8 = pwVar7;
    if (bVar15 != 0) {
      pwVar8 = pwVar7 + uVar6;
      uVar13 = (ulong)uVar6 + 0x3fffffffffffffff;
      uVar16 = uVar13 & 0x3fffffffffffffff;
      auVar23._8_4_ = (int)uVar16;
      auVar23._0_8_ = uVar16;
      auVar23._12_4_ = (int)(uVar16 >> 0x20);
      lVar12 = 0;
      auVar23 = auVar23 ^ _DAT_00201020;
      do {
        auVar28._8_4_ = (int)lVar12;
        auVar28._0_8_ = lVar12;
        auVar28._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar32 = (auVar28 | auVar4) ^ auVar3;
        iVar26 = auVar23._4_4_;
        if ((bool)(~(auVar32._4_4_ == iVar26 && auVar23._0_4_ < auVar32._0_4_ ||
                    iVar26 < auVar32._4_4_) & 1)) {
          pwVar7[lVar12] = L'0';
        }
        if ((auVar32._12_4_ != auVar23._12_4_ || auVar32._8_4_ <= auVar23._8_4_) &&
            auVar32._12_4_ <= auVar23._12_4_) {
          pwVar7[lVar12 + 1] = L'0';
        }
        auVar28 = (auVar28 | auVar5) ^ auVar3;
        iVar33 = auVar28._4_4_;
        if (iVar33 <= iVar26 && (iVar33 != iVar26 || auVar28._0_4_ <= auVar23._0_4_)) {
          pwVar7[lVar12 + 2] = L'0';
          pwVar7[lVar12 + 3] = L'0';
        }
        lVar12 = lVar12 + 4;
      } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
    }
    *pwVar8 = (uint)((*(uint *)&(this->specs_).field_0x4 >> 0x10 & 1) == 0) << 5 | 0x45;
    pwVar7 = write_exponent<wchar_t,wchar_t*>(uVar9 - 1,pwVar8 + 1);
    return pwVar7;
  }
  if ((int)uVar6 < 0) {
    if ((int)uVar9 < 1) {
      *it = L'0';
      uVar10 = -uVar9;
      uVar6 = (this->specs_).precision;
      uVar2 = uVar10;
      if (SBORROW4(uVar6,uVar10) != (int)(uVar6 + uVar9) < 0) {
        uVar2 = uVar6;
      }
      if ((int)uVar6 < 0) {
        uVar2 = uVar10;
      }
      if (0 < (int)uVar11 && ((this->specs_).field_0x6 & 0x20) == 0) {
        do {
          if (this->digits_[uVar13 - 1] != '0') goto LAB_001cae10;
          bVar1 = 1 < (long)uVar13;
          uVar13 = uVar13 - 1;
        } while (bVar1);
        uVar13 = 0;
      }
LAB_001cae10:
      if (uVar2 == 0 && (int)uVar13 == 0) {
        pwVar8 = it + 1;
      }
      else {
        pwVar8 = it + 2;
        it[1] = this->decimal_point_;
        auVar5 = _DAT_0020a170;
        auVar4 = _DAT_00207570;
        auVar3 = _DAT_00201020;
        if (0 < (int)uVar2) {
          pwVar8 = pwVar8 + uVar2;
          uVar16 = (ulong)uVar2 + 0x3fffffffffffffff;
          uVar17 = uVar16 & 0x3fffffffffffffff;
          auVar25._8_4_ = (int)uVar17;
          auVar25._0_8_ = uVar17;
          auVar25._12_4_ = (int)(uVar17 >> 0x20);
          lVar12 = 0;
          auVar25 = auVar25 ^ _DAT_00201020;
          do {
            auVar30._8_4_ = (int)lVar12;
            auVar30._0_8_ = lVar12;
            auVar30._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar23 = (auVar30 | auVar4) ^ auVar3;
            iVar26 = auVar25._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar26 && auVar25._0_4_ < auVar23._0_4_ ||
                        iVar26 < auVar23._4_4_) & 1)) {
              it[lVar12 + 2] = L'0';
            }
            if ((auVar23._12_4_ != auVar25._12_4_ || auVar23._8_4_ <= auVar25._8_4_) &&
                auVar23._12_4_ <= auVar25._12_4_) {
              it[lVar12 + 3] = L'0';
            }
            auVar23 = (auVar30 | auVar5) ^ auVar3;
            iVar33 = auVar23._4_4_;
            if (iVar33 <= iVar26 && (iVar33 != iVar26 || auVar23._0_4_ <= auVar25._0_4_)) {
              it[lVar12 + 4] = L'0';
              it[lVar12 + 5] = L'0';
            }
            lVar12 = lVar12 + 4;
          } while ((uVar17 - ((uint)uVar16 & 3)) + 4 != lVar12);
        }
        if (0 < (int)uVar13) {
          pcVar19 = this->digits_;
          lVar12 = (uVar13 & 0xffffffff) + 1;
          do {
            *pwVar8 = (int)*pcVar19;
            pcVar19 = pcVar19 + 1;
            pwVar8 = pwVar8 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
    }
    else {
      lVar20 = (long)(int)uVar11;
      pcVar19 = this->digits_;
      uVar13 = (ulong)uVar9;
      lVar12 = uVar13 + 1;
      lVar21 = 0;
      lVar14 = 0;
      do {
        it[lVar21] = (int)pcVar19[lVar21];
        lVar12 = lVar12 + -1;
        lVar14 = lVar14 + -4;
        lVar21 = lVar21 + 1;
      } while (1 < lVar12);
      pcVar18 = pcVar19 + uVar13;
      if (((this->specs_).field_0x6 & 0x20) == 0) {
        lVar12 = -lVar14;
        uVar6 = uVar11 - 1;
        if ((int)uVar9 < (int)(uVar11 - 1)) {
          uVar6 = uVar9;
        }
        do {
          if (pcVar19[lVar20 + -1] != '0') {
            uVar6 = (uint)lVar20;
            break;
          }
          lVar20 = lVar20 + -1;
        } while ((long)uVar13 < lVar20);
        if (uVar6 != uVar9) {
          lVar12 = 4 - lVar14;
          it[lVar21] = this->decimal_point_;
        }
        pwVar8 = (wchar_t *)((long)it + lVar12);
        lVar12 = (long)(int)uVar6 - uVar13;
        if (lVar12 != 0 && (long)uVar13 <= (long)(int)uVar6) {
          lVar12 = lVar12 + 1;
          do {
            *pwVar8 = (int)*pcVar18;
            pcVar18 = pcVar18 + 1;
            pwVar8 = pwVar8 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
      }
      else {
        pwVar7 = (wchar_t *)((long)it + (4 - lVar14));
        it[lVar21] = this->decimal_point_;
        if (lVar20 - uVar13 != 0 && (long)uVar13 <= lVar20) {
          lVar12 = (lVar20 - uVar13) + 1;
          do {
            *pwVar7 = (int)*pcVar18;
            pcVar18 = pcVar18 + 1;
            pwVar7 = pwVar7 + 1;
            lVar12 = lVar12 + -1;
          } while (1 < lVar12);
        }
        auVar5 = _DAT_0020a170;
        auVar4 = _DAT_00207570;
        auVar3 = _DAT_00201020;
        iVar26 = (this->specs_).precision;
        uVar6 = iVar26 - uVar11;
        pwVar8 = pwVar7;
        if ((uVar6 != 0 && (int)uVar11 <= iVar26) && (uVar6 != 0 && (int)uVar11 <= iVar26)) {
          uVar13 = (ulong)uVar6 + 0x3fffffffffffffff;
          uVar16 = uVar13 & 0x3fffffffffffffff;
          auVar32._8_4_ = (int)uVar16;
          auVar32._0_8_ = uVar16;
          auVar32._12_4_ = (int)(uVar16 >> 0x20);
          lVar12 = 0;
          auVar32 = auVar32 ^ _DAT_00201020;
          do {
            auVar31._8_4_ = (int)lVar12;
            auVar31._0_8_ = lVar12;
            auVar31._12_4_ = (int)((ulong)lVar12 >> 0x20);
            auVar23 = (auVar31 | auVar4) ^ auVar3;
            iVar26 = auVar32._4_4_;
            if ((bool)(~(auVar23._4_4_ == iVar26 && auVar32._0_4_ < auVar23._0_4_ ||
                        iVar26 < auVar23._4_4_) & 1)) {
              pwVar7[lVar12] = L'0';
            }
            if ((auVar23._12_4_ != auVar32._12_4_ || auVar23._8_4_ <= auVar32._8_4_) &&
                auVar23._12_4_ <= auVar32._12_4_) {
              pwVar7[lVar12 + 1] = L'0';
            }
            auVar23 = (auVar31 | auVar5) ^ auVar3;
            iVar33 = auVar23._4_4_;
            if (iVar33 <= iVar26 && (iVar33 != iVar26 || auVar23._0_4_ <= auVar32._0_4_)) {
              pwVar7[lVar12 + 2] = L'0';
              pwVar7[lVar12 + 3] = L'0';
            }
            lVar12 = lVar12 + 4;
            pwVar8 = pwVar7 + uVar6;
          } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
        }
      }
    }
  }
  else {
    if (0 < (int)uVar11) {
      pcVar19 = this->digits_;
      lVar12 = uVar13 + 1;
      do {
        *it = (int)*pcVar19;
        pcVar19 = pcVar19 + 1;
        it = it + 1;
        lVar12 = lVar12 + -1;
      } while (1 < lVar12);
    }
    auVar5 = _DAT_0020a170;
    auVar4 = _DAT_00207570;
    auVar3 = _DAT_00201020;
    pwVar7 = it;
    if (uVar16 != 0) {
      pwVar7 = it + uVar16;
      uVar13 = uVar16 + 0x3fffffffffffffff & 0x3fffffffffffffff;
      auVar22._8_4_ = (int)uVar13;
      auVar22._0_8_ = uVar13;
      auVar22._12_4_ = (int)(uVar13 >> 0x20);
      lVar12 = 0;
      auVar22 = auVar22 ^ _DAT_00201020;
      do {
        auVar27._8_4_ = (int)lVar12;
        auVar27._0_8_ = lVar12;
        auVar27._12_4_ = (int)((ulong)lVar12 >> 0x20);
        auVar23 = (auVar27 | auVar4) ^ auVar3;
        iVar26 = auVar22._4_4_;
        if ((bool)(~(auVar23._4_4_ == iVar26 && auVar22._0_4_ < auVar23._0_4_ ||
                    iVar26 < auVar23._4_4_) & 1)) {
          it[lVar12] = L'0';
        }
        if ((auVar23._12_4_ != auVar22._12_4_ || auVar23._8_4_ <= auVar22._8_4_) &&
            auVar23._12_4_ <= auVar22._12_4_) {
          it[lVar12 + 1] = L'0';
        }
        auVar23 = (auVar27 | auVar5) ^ auVar3;
        iVar33 = auVar23._4_4_;
        if (iVar33 <= iVar26 && (iVar33 != iVar26 || auVar23._0_4_ <= auVar22._0_4_)) {
          it[lVar12 + 2] = L'0';
          it[lVar12 + 3] = L'0';
        }
        lVar12 = lVar12 + 4;
      } while ((uVar13 - ((uint)(uVar16 + 0x3fffffffffffffff) & 3)) + 4 != lVar12);
    }
    pwVar8 = pwVar7;
    if (((this->specs_).field_0x6 & 0x20) != 0) {
      *pwVar7 = this->decimal_point_;
      auVar5 = _DAT_0020a170;
      auVar4 = _DAT_00207570;
      auVar3 = _DAT_00201020;
      iVar26 = (this->specs_).precision;
      uVar11 = iVar26 - uVar9;
      if (uVar11 == 0 || iVar26 < (int)uVar9) {
        pwVar8 = pwVar7 + 1;
        if ((this->specs_).field_0x4 != '\x02') {
          pwVar7[1] = L'0';
          pwVar8 = pwVar7 + 2;
        }
      }
      else {
        uVar13 = (ulong)uVar11 + 0x3fffffffffffffff;
        uVar16 = uVar13 & 0x3fffffffffffffff;
        auVar24._8_4_ = (int)uVar16;
        auVar24._0_8_ = uVar16;
        auVar24._12_4_ = (int)(uVar16 >> 0x20);
        lVar12 = 0;
        auVar24 = auVar24 ^ _DAT_00201020;
        do {
          auVar29._8_4_ = (int)lVar12;
          auVar29._0_8_ = lVar12;
          auVar29._12_4_ = (int)((ulong)lVar12 >> 0x20);
          auVar23 = (auVar29 | auVar4) ^ auVar3;
          iVar26 = auVar24._4_4_;
          if ((bool)(~(auVar23._4_4_ == iVar26 && auVar24._0_4_ < auVar23._0_4_ ||
                      iVar26 < auVar23._4_4_) & 1)) {
            pwVar7[lVar12 + 1] = L'0';
          }
          if ((auVar23._12_4_ != auVar24._12_4_ || auVar23._8_4_ <= auVar24._8_4_) &&
              auVar23._12_4_ <= auVar24._12_4_) {
            pwVar7[lVar12 + 2] = L'0';
          }
          auVar23 = (auVar29 | auVar5) ^ auVar3;
          iVar33 = auVar23._4_4_;
          if (iVar33 <= iVar26 && (iVar33 != iVar26 || auVar23._0_4_ <= auVar24._0_4_)) {
            pwVar7[lVar12 + 3] = L'0';
            pwVar7[lVar12 + 4] = L'0';
          }
          lVar12 = lVar12 + 4;
          pwVar8 = pwVar7 + 1 + uVar11;
        } while ((uVar16 - ((uint)uVar13 & 3)) + 4 != lVar12);
      }
    }
  }
  return pwVar8;
}

Assistant:

It prettify(It it) const {
    // pow(10, full_exp - 1) <= v <= pow(10, full_exp).
    int full_exp = num_digits_ + exp_;
    if (specs_.format == float_format::exp) {
      // Insert a decimal point after the first digit and add an exponent.
      *it++ = static_cast<Char>(*digits_);
      int num_zeros = specs_.precision - num_digits_;
      bool trailing_zeros = num_zeros > 0 && specs_.trailing_zeros;
      if (num_digits_ > 1 || trailing_zeros) *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + 1, digits_ + num_digits_, it);
      if (trailing_zeros)
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      *it++ = static_cast<Char>(specs_.upper ? 'E' : 'e');
      return write_exponent<Char>(full_exp - 1, it);
    }
    if (num_digits_ <= full_exp) {
      // 1234e7 -> 12340000000[.0+]
      it = copy_str<Char>(digits_, digits_ + num_digits_, it);
      it = std::fill_n(it, full_exp - num_digits_, static_cast<Char>('0'));
      if (specs_.trailing_zeros) {
        *it++ = decimal_point_;
        int num_zeros = specs_.precision - full_exp;
        if (num_zeros <= 0) {
          if (specs_.format != float_format::fixed)
            *it++ = static_cast<Char>('0');
          return it;
        }
#ifdef FUZZING_BUILD_MODE_UNSAFE_FOR_PRODUCTION
        if (num_zeros > 1000)
          throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else if (full_exp > 0) {
      // 1234e-2 -> 12.34[0+]
      it = copy_str<Char>(digits_, digits_ + full_exp, it);
      if (!specs_.trailing_zeros) {
        // Remove trailing zeros.
        int num_digits = num_digits_;
        while (num_digits > full_exp && digits_[num_digits - 1] == '0')
          --num_digits;
        if (num_digits != full_exp) *it++ = decimal_point_;
        return copy_str<Char>(digits_ + full_exp, digits_ + num_digits, it);
      }
      *it++ = decimal_point_;
      it = copy_str<Char>(digits_ + full_exp, digits_ + num_digits_, it);
      if (specs_.precision > num_digits_) {
        // Add trailing zeros.
        int num_zeros = specs_.precision - num_digits_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
      }
    } else {
      // 1234e-6 -> 0.001234
      *it++ = static_cast<Char>('0');
      int num_zeros = -full_exp;
      if (specs_.precision >= 0 && specs_.precision < num_zeros)
        num_zeros = specs_.precision;
      int num_digits = num_digits_;
      if (!specs_.trailing_zeros)
        while (num_digits > 0 && digits_[num_digits - 1] == '0') --num_digits;
      if (num_zeros != 0 || num_digits != 0) {
        *it++ = decimal_point_;
        it = std::fill_n(it, num_zeros, static_cast<Char>('0'));
        it = copy_str<Char>(digits_, digits_ + num_digits, it);
      }
    }
    return it;
  }